

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O3

int Gia_ManBmcFindFirst(Gia_Man_t *pFrames)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar6 = pFrames->vCos->nSize;
  uVar5 = uVar6 - pFrames->nRegs;
  if (uVar5 != 0 && pFrames->nRegs <= (int)uVar6) {
    uVar4 = 0;
    uVar3 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == uVar4) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pFrames->vCos->pArray[uVar4];
      if (((long)iVar1 < 0) || (pFrames->nObjs <= iVar1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = pFrames->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) {
        return -1;
      }
      uVar6 = (uint)*(undefined8 *)(pGVar2 + iVar1);
      if (pGVar2 != (Gia_Obj_t *)
                    ((ulong)(uVar6 >> 0x1d & 1) ^
                    (ulong)(pGVar2 + iVar1 + -(ulong)(uVar6 & 0x1fffffff)))) {
        return (int)uVar4;
      }
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  return -1;
}

Assistant:

int Gia_ManBmcFindFirst( Gia_Man_t * pFrames )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPo( pFrames, pObj, i )
        if ( Gia_ObjChild0(pObj) != Gia_ManConst0(pFrames) )
            return i;
    return -1;
}